

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

size_t secp256k1_context_preallocated_size(uint flags)

{
  undefined4 in_register_0000003c;
  long *plVar1;
  
  plVar1 = (long *)CONCAT44(in_register_0000003c,flags);
  if ((char)flags == '\x01') {
    return (ulong)((flags & 0x100) << 0xb) | 0xe0;
  }
  secp256k1_context_preallocated_size_cold_1();
  return (ulong)(*plVar1 != 0) << 0x13 | 0xe0;
}

Assistant:

size_t secp256k1_context_preallocated_size(unsigned int flags) {
    size_t ret = ROUND_TO_ALIGN(sizeof(secp256k1_context));

    if (EXPECT((flags & SECP256K1_FLAGS_TYPE_MASK) != SECP256K1_FLAGS_TYPE_CONTEXT, 0)) {
            secp256k1_callback_call(&default_illegal_callback,
                                    "Invalid flags");
            return 0;
    }

    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_SIGN) {
        ret += SECP256K1_ECMULT_GEN_CONTEXT_PREALLOCATED_SIZE;
    }
    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_VERIFY) {
        ret += SECP256K1_ECMULT_CONTEXT_PREALLOCATED_SIZE;
    }
    return ret;
}